

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::readBasisFile(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,char *filename,NameSet *rowNames,NameSet *colNames)

{
  bool bVar1;
  
  clearBasis(this);
  (*this->_statistics->readingTime->_vptr_Timer[3])();
  if (this->_isRealLPLoaded == false) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::loadLP(&this->_solver,this->_realLP,true);
    (**(this->_realLP->
       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .
       super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._vptr_ClassArray)();
    free(this->_realLP);
    this->_realLP =
         &(this->_solver).
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    this->_isRealLPLoaded = true;
  }
  bVar1 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::readBasisFile(&this->_solver,filename,rowNames,colNames);
  this->_hasBasis = bVar1;
  (*this->_statistics->readingTime->_vptr_Timer[4])();
  return this->_hasBasis;
}

Assistant:

bool SoPlexBase<R>::readBasisFile(const char* filename, const NameSet* rowNames,
                                  const NameSet* colNames)
{
   clearBasis();
   /// @todo can't we just remove the else code?
#if 1
   assert(filename != nullptr);
   assert(_realLP != nullptr);

   // start timing
   _statistics->readingTime->start();

   // read
   if(!_isRealLPLoaded)
   {
      assert(_realLP != &_solver);

      _solver.loadLP(*_realLP);
      _realLP->~SPxLPBase<R>();
      spx_free(_realLP);
      _realLP = &_solver;
      _isRealLPLoaded = true;
   }

   _hasBasis = _solver.readBasisFile(filename, rowNames, colNames);
   assert(_hasBasis == (_solver.basis().status() > SPxBasisBase<R>::NO_PROBLEM));

   // stop timing
   _statistics->readingTime->stop();

   return _hasBasis;
#else
   // this is alternative code for reading bases without the SPxSolverBase class
   assert(filename != nullptr);

   // start timing
   _statistics->readingTime->start();

   // read
   spxifstream file(filename);

   if(!file)
      return false;

   // get problem size
   int numRows = numRows();
   int numCols = numCols();

   // prepare column names
   const NameSet* colNamesPtr = colNames;
   NameSet* tmpColNames = 0;

   if(colNames == 0)
   {
      std::stringstream name;

      spx_alloc(tmpColNames);
      tmpColNames = new(tmpColNames) NameSet();
      tmpColNames->reMax(numCols);

      for(int j = 0; j < numCols; ++j)
      {
         name << "x" << j;
         tmpColNames->add(name.str().c_str());
      }

      colNamesPtr = tmpColNames;
   }

   // prepare row names
   const NameSet* rowNamesPtr = rowNames;
   NameSet* tmpRowNames = 0;

   if(rowNamesPtr == 0)
   {
      std::stringstream name;

      spx_alloc(tmpRowNames);
      tmpRowNames = new(tmpRowNames) NameSet();
      tmpRowNames->reMax(numRows);

      for(int i = 0; i < numRows; ++i)
      {
         name << "C" << i;
         tmpRowNames->add(name.str().c_str());
      }

      rowNamesPtr = tmpRowNames;
   }

   // initialize with default slack basis
   _basisStatusRows.reSize(numRows);
   _basisStatusCols.reSize(numCols);

   for(int i = 0; i < numRows; i++)
      _basisStatusRows[i] = SPxSolverBase<R>::BASIC;

   for(int i = 0; i < numCols; i++)
   {
      if(lowerRealInternal(i) == upperRealInternal(i))
         _basisStatusCols[i] = SPxSolverBase<R>::FIXED;
      else if(lowerRealInternal(i) <= double(-realParam(SoPlexBase<R>::INFTY))
              && upperRealInternal(i) >= double(realParam(SoPlexBase<R>::INFTY)))
         _basisStatusCols[i] = SPxSolverBase<R>::ZERO;
      else if(lowerRealInternal(i) <= double(-realParam(SoPlexBase<R>::INFTY)))
         _basisStatusCols[i] = SPxSolverBase<R>::ON_UPPER;
      else
         _basisStatusCols[i] = SPxSolverBase<R>::ON_LOWER;
   }

   // read basis
   MPSInput mps(file);

   if(mps.readLine() && (mps.field0() != nullptr) && !strcmp(mps.field0(), "NAME"))
   {
      while(mps.readLine())
      {
         int c = -1;
         int r = -1;

         if(mps.field0() != nullptr && !strcmp(mps.field0(), "ENDATA"))
         {
            mps.setSection(MPSInput::ENDATA);
            break;
         }

         if(mps.field1() == 0 || mps.field2() == 0)
            break;

         if((c = colNamesPtr->number(mps.field2())) < 0)
            break;

         if(*mps.field1() == 'X')
         {
            if(mps.field3() == 0 || (r = rowNamesPtr->number(mps.field3())) < 0)
               break;
         }

         if(!strcmp(mps.field1(), "XU"))
         {
            _basisStatusCols[c] = SPxSolverBase<R>::BASIC;

            if(_rowTypes[r] == SoPlexBase<R>::RANGETYPE_LOWER)
               _basisStatusRows[r] = SPxSolverBase<R>::ON_LOWER;
            else if(_rowTypes[r] == SoPlexBase<R>::RANGETYPE_FIXED)
               _basisStatusRows[r] = SPxSolverBase<R>::FIXED;
            else
               _basisStatusRows[r] = SPxSolverBase<R>::ON_UPPER;
         }
         else if(!strcmp(mps.field1(), "XL"))
         {
            _basisStatusCols[c] = SPxSolverBase<R>::BASIC;

            if(_rowTypes[r] == SoPlexBase<R>::RANGETYPE_UPPER)
               _basisStatusRows[r] = SPxSolverBase<R>::ON_UPPER;
            else if(_rowTypes[r] == SoPlexBase<R>::RANGETYPE_FIXED)
               _basisStatusRows[r] = SPxSolverBase<R>::FIXED;
            else
               _basisStatusRows[r] = SPxSolverBase<R>::ON_LOWER;
         }
         else if(!strcmp(mps.field1(), "UL"))
         {
            _basisStatusCols[c] = SPxSolverBase<R>::ON_UPPER;
         }
         else if(!strcmp(mps.field1(), "LL"))
         {
            _basisStatusCols[c] = SPxSolverBase<R>::ON_LOWER;
         }
         else
         {
            mps.syntaxError();
            break;
         }
      }
   }

   if(rowNames == 0)
   {
      tmpRowNames->~NameSet();
      spx_free(tmpRowNames);
   }

   if(colNames == 0)
   {
      tmpColNames->~NameSet();
      spx_free(tmpColNames);
   }

   _hasBasis = !mps.hasError();

   // stop timing
   _statistics->readingTime->stop();

   return _hasBasis;
#endif
}